

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

ErrorComparison ts_parser__compare_versions(TSParser *self,ErrorStatus a,ErrorStatus b)

{
  TSParser *self_local;
  undefined4 uStack_28;
  ErrorStatus b_local;
  ErrorStatus a_local;
  
  b_local.dynamic_precedence = a.cost;
  self_local._4_4_ = b.cost;
  if ((((undefined1  [16])a & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) &&
     (((undefined1  [16])b & (undefined1  [16])0x100000000) != (undefined1  [16])0x0)) {
    if ((uint)b_local.dynamic_precedence < self_local._4_4_) {
      a_local.dynamic_precedence = 0;
    }
    else {
      a_local.dynamic_precedence = 1;
    }
  }
  else if ((((undefined1  [16])a & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) ||
          (((undefined1  [16])b & (undefined1  [16])0x100000000) != (undefined1  [16])0x0)) {
    if ((uint)b_local.dynamic_precedence < self_local._4_4_) {
      b_local._12_4_ = a.node_count;
      if ((self_local._4_4_ - b_local.dynamic_precedence) * (b_local._12_4_ + 1) < 0x641) {
        a_local.dynamic_precedence = 1;
      }
      else {
        a_local.dynamic_precedence = 0;
      }
    }
    else if (self_local._4_4_ < (uint)b_local.dynamic_precedence) {
      uStack_28 = b.node_count;
      if ((b_local.dynamic_precedence - self_local._4_4_) * (uStack_28 + 1) < 0x641) {
        a_local.dynamic_precedence = 3;
      }
      else {
        a_local.dynamic_precedence = 4;
      }
    }
    else {
      a_local.cost = a.dynamic_precedence;
      b_local.cost = b.dynamic_precedence;
      if ((int)b_local.cost < (int)a_local.cost) {
        a_local.dynamic_precedence = 1;
      }
      else if ((int)a_local.cost < (int)b_local.cost) {
        a_local.dynamic_precedence = 3;
      }
      else {
        a_local.dynamic_precedence = 2;
      }
    }
  }
  else if (self_local._4_4_ < (uint)b_local.dynamic_precedence) {
    a_local.dynamic_precedence = 4;
  }
  else {
    a_local.dynamic_precedence = 3;
  }
  return a_local.dynamic_precedence;
}

Assistant:

static ErrorComparison ts_parser__compare_versions(TSParser *self, ErrorStatus a, ErrorStatus b) {
  if (!a.is_in_error && b.is_in_error) {
    if (a.cost < b.cost) {
      return ErrorComparisonTakeLeft;
    } else {
      return ErrorComparisonPreferLeft;
    }
  }

  if (a.is_in_error && !b.is_in_error) {
    if (b.cost < a.cost) {
      return ErrorComparisonTakeRight;
    } else {
      return ErrorComparisonPreferRight;
    }
  }

  if (a.cost < b.cost) {
    if ((b.cost - a.cost) * (1 + a.node_count) > MAX_COST_DIFFERENCE) {
      return ErrorComparisonTakeLeft;
    } else {
      return ErrorComparisonPreferLeft;
    }
  }

  if (b.cost < a.cost) {
    if ((a.cost - b.cost) * (1 + b.node_count) > MAX_COST_DIFFERENCE) {
      return ErrorComparisonTakeRight;
    } else {
      return ErrorComparisonPreferRight;
    }
  }

  if (a.dynamic_precedence > b.dynamic_precedence) return ErrorComparisonPreferLeft;
  if (b.dynamic_precedence > a.dynamic_precedence) return ErrorComparisonPreferRight;
  return ErrorComparisonNone;
}